

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_1bf255::SwiftCompilerShellCommand::start
          (SwiftCompilerShellCommand *this,BuildSystem *system,TaskInterface ti)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  StringRef name;
  BuildKey getVersionKey;
  KeyType local_68;
  BuildKey local_48;
  TaskInterface local_28;
  
  local_28.ctx = ti.ctx;
  local_28.impl = ti.impl;
  llbuild::buildsystem::ExternalCommand::start(&this->super_ExternalCommand,system,ti);
  local_68.key._M_dataplus._M_p = (this->executable)._M_dataplus._M_p;
  local_68.key._M_string_length = (this->executable)._M_string_length;
  name.Length = 0x11;
  name.Data = "swift-get-version";
  llbuild::buildsystem::BuildKey::BuildKey<llvm::StringRef>
            (&local_48,'X',name,(StringRef *)&local_68);
  paVar1 = &local_68.key.field_2;
  local_68.key._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,local_48.key.key._M_dataplus._M_p,
             local_48.key.key._M_dataplus._M_p + local_48.key.key._M_string_length);
  llbuild::core::TaskInterface::request(&local_28,&local_68,0xfffffffffffffeff);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.key._M_dataplus._M_p != paVar1) {
    operator_delete(local_68.key._M_dataplus._M_p,local_68.key.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.key.key._M_dataplus._M_p != &local_48.key.key.field_2) {
    operator_delete(local_48.key.key._M_dataplus._M_p,
                    local_48.key.key.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

virtual void start(BuildSystem& system, TaskInterface ti) override {
    ExternalCommand::start(system, ti);
    
    // The Swift compiler version is also an input.
    //
    // FIXME: We need to fix the input ID situation, this is not extensible. We
    // either have to build a registration of the custom tasks so they can divy
    // up the input ID namespace, or we should just use the keys. Probably move
    // to just using the keys, unless there is a place where that is really not
    // cheap.
    auto getVersionKey = BuildKey::makeCustomTask(
        "swift-get-version", executable);
    ti.request(getVersionKey.toData(), core::BuildEngine::kMaximumInputID - 1);
  }